

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkFanio.c
# Opt level: O2

void Nwk_ObjAddFanin(Nwk_Obj_t *pObj,Nwk_Obj_t *pFanin)

{
  Nwk_Obj_t **ppNVar1;
  long lVar2;
  int iVar3;
  
  if (pObj->pMan != pFanin->pMan) {
    __assert_fail("pObj->pMan == pFanin->pMan",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkFanio.c"
                  ,0xa8,"void Nwk_ObjAddFanin(Nwk_Obj_t *, Nwk_Obj_t *)");
  }
  if ((-1 < pObj->Id) && (-1 < pFanin->Id)) {
    if (pObj->nFanouts + pObj->nFanins == pObj->nFanioAlloc) {
      Nwk_ManReallocNode(pObj);
    }
    if (pFanin->nFanouts + pFanin->nFanins == pFanin->nFanioAlloc) {
      Nwk_ManReallocNode(pFanin);
    }
    iVar3 = pObj->nFanins;
    for (lVar2 = (long)(pObj->nFanouts + iVar3); ppNVar1 = pObj->pFanio, iVar3 < lVar2;
        lVar2 = lVar2 + -1) {
      ppNVar1[lVar2] = ppNVar1[lVar2 + -1];
    }
    pObj->nFanins = iVar3 + 1;
    ppNVar1[iVar3] = pFanin;
    iVar3 = pFanin->nFanouts;
    pFanin->nFanouts = iVar3 + 1;
    pFanin->pFanio[(long)pFanin->nFanins + (long)iVar3] = pObj;
    iVar3 = (uint)((*(uint *)&pObj->field_0x20 & 7) == 3) + pFanin->Level;
    if (iVar3 < pObj->Level) {
      iVar3 = pObj->Level;
    }
    pObj->Level = iVar3;
    return;
  }
  __assert_fail("pObj->Id >= 0 && pFanin->Id >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkFanio.c"
                ,0xa9,"void Nwk_ObjAddFanin(Nwk_Obj_t *, Nwk_Obj_t *)");
}

Assistant:

void Nwk_ObjAddFanin( Nwk_Obj_t * pObj, Nwk_Obj_t * pFanin )
{
    int i;
    assert( pObj->pMan == pFanin->pMan );
    assert( pObj->Id >= 0 && pFanin->Id >= 0 );
    if ( Nwk_ObjReallocIsNeeded(pObj) )
        Nwk_ManReallocNode( pObj );
    if ( Nwk_ObjReallocIsNeeded(pFanin) )
        Nwk_ManReallocNode( pFanin );
    for ( i = pObj->nFanins + pObj->nFanouts; i > pObj->nFanins; i-- )
        pObj->pFanio[i] = pObj->pFanio[i-1];
    pObj->pFanio[pObj->nFanins++] = pFanin;
    pFanin->pFanio[pFanin->nFanins + pFanin->nFanouts++] = pObj;
    pObj->Level = Abc_MaxInt( pObj->Level, pFanin->Level + Nwk_ObjIsNode(pObj) );
}